

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

IdentifierList * __thiscall
Parser::identifierList_abi_cxx11_(IdentifierList *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unsigned_long local_40;
  unsigned_long uStack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = match(this,RightParen);
  if (!bVar3) {
    paVar1 = &local_60.field_2;
    pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
    local_40 = (this->currentToken).line;
    uStack_38 = (this->currentToken).col;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    consume(this,Identifier,"identifier");
    while( true ) {
      bVar3 = match(this,Comma);
      if (!bVar3) break;
      consume(this);
      pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
      local_40 = (this->currentToken).line;
      uStack_38 = (this->currentToken).col;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      consume(this,Identifier,"identifier");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierList Parser::identifierList() {
    IdentifierList identList;

    if(match(TokenType::RightParen))
        return identList;

    identList.push_back(token().lexeme);
    consume(TokenType::Identifier, "identifier");

    while(match(TokenType::Comma)) {
        consume();
        identList.push_back(token().lexeme);
        consume(TokenType::Identifier, "identifier");
    }

    return identList;
}